

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

void __thiscall despot::ChainState::Init(ChainState *this,int num_mdp_states,int num_mdp_actions)

{
  pointer pvVar1;
  ulong uVar2;
  int s;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_00;
  ACT_TYPE action;
  ulong uVar6;
  
  this_00 = &this->mdp_transitions_;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(this_00,(long)num_mdp_states);
  uVar4 = 0;
  uVar5 = 0;
  if (0 < num_mdp_actions) {
    uVar5 = (ulong)(uint)num_mdp_actions;
  }
  uVar2 = 0;
  if (0 < num_mdp_states) {
    uVar2 = (ulong)(uint)num_mdp_states;
  }
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((this_00->
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + uVar4,(long)num_mdp_actions);
    for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 (*(long *)&(this_00->
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar4].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data + uVar6 * 0x18),(long)num_mdp_states);
      pvVar1 = (this_00->
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (uVar3 = 0; (uint)num_mdp_states != uVar3; uVar3 = uVar3 + 1) {
        *(undefined8 *)
         (*(long *)(*(long *)&pvVar1[uVar4].
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data + uVar6 * 0x18) + uVar3 * 8) = 0;
      }
    }
  }
  return;
}

Assistant:

void ChainState::Init(int num_mdp_states, int num_mdp_actions) {
	mdp_transitions_.resize(num_mdp_states);
	for (int state = 0; state < num_mdp_states; state++) {
		mdp_transitions_[state].resize(num_mdp_actions);
		for (ACT_TYPE action = 0; action < num_mdp_actions; action++) {
			mdp_transitions_[state][action].resize(num_mdp_states);
			for (int s = 0; s < num_mdp_states; s++)
				mdp_transitions_[state][action][s] = 0;
		}
	}
}